

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.hpp
# Opt level: O1

double * __thiscall deci::parser_t::value_type::as<double>(value_type *this)

{
  char *__s1;
  int iVar1;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O1/iec61131.y.hpp"
                  ,0x136,"T &deci::parser_t::value_type::as() [T = double]");
  }
  __s1 = *(char **)(this->yytypeid_ + 8);
  if (__s1 == _typeinfo) {
    return (double *)this;
  }
  if ((*__s1 != '*') && (iVar1 = strcmp(__s1,_typeinfo), iVar1 == 0)) {
    return (double *)this;
  }
  __assert_fail("*yytypeid_ == typeid (T)",
                "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O1/iec61131.y.hpp"
                ,0x137,"T &deci::parser_t::value_type::as() [T = double]");
}

Assistant:

T&
    as () YY_NOEXCEPT
    {
      YY_ASSERT (yytypeid_);
      YY_ASSERT (*yytypeid_ == typeid (T));
      YY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }